

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::ByteSizeLong(SimpleRecurrentLayerParams *this)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  
  if (this->activation_ == (ActivationParams *)0x0 ||
      this == (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = ActivationParams::ByteSizeLong(this->activation_);
    uVar6 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->weightmatrix_ != (WeightParams *)0x0 &&
      this != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->weightmatrix_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->recursionmatrix_ != (WeightParams *)0x0 &&
      this != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->recursionmatrix_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->biasvector_ != (WeightParams *)0x0 &&
      this != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->biasvector_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->inputvectorsize_ != 0) {
    uVar5 = this->inputvectorsize_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->outputvectorsize_ != 0) {
    uVar5 = this->outputvectorsize_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3 + 2;
  if (this->sequenceoutput_ == false) {
    sVar4 = sVar3;
  }
  sVar3 = sVar4 + 3;
  if (this->hasbiasvector_ == false) {
    sVar3 = sVar4;
  }
  sVar4 = sVar3 + 3;
  if (this->reverseinput_ == false) {
    sVar4 = sVar3;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t SimpleRecurrentLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SimpleRecurrentLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.ActivationParams activation = 10;
  if (this->has_activation()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->activation_);
  }

  // .CoreML.Specification.WeightParams weightMatrix = 30;
  if (this->has_weightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->weightmatrix_);
  }

  // .CoreML.Specification.WeightParams recursionMatrix = 31;
  if (this->has_recursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->recursionmatrix_);
  }

  // .CoreML.Specification.WeightParams biasVector = 32;
  if (this->has_biasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->biasvector_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVector = 20;
  if (this->hasbiasvector() != 0) {
    total_size += 2 + 1;
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}